

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::anon_unknown_0::DeleteLeafEdge(CordRep *rep)

{
  bool bVar1;
  CordRep *pCVar2;
  CordRepExternal *pCVar3;
  CordRepSubstring *pCVar4;
  
  bVar1 = IsDataEdge(rep);
  if (!bVar1) {
    __assert_fail("IsDataEdge(rep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0xd8,"void absl::cord_internal::(anonymous namespace)::DeleteLeafEdge(CordRep *)"
                 );
  }
  if (5 < rep->tag) {
    pCVar2 = &CordRep::flat(rep)->super_CordRep;
    CordRepFlat::Delete(pCVar2);
    return;
  }
  if (rep->tag == 5) {
    pCVar3 = CordRep::external(rep);
    CordRepExternal::Delete(&pCVar3->super_CordRep);
    return;
  }
  pCVar4 = CordRep::substring(rep);
  pCVar2 = pCVar4->child;
  bVar1 = RefcountAndFlags::Decrement(&pCVar2->refcount);
  if (!bVar1) {
    if (pCVar2->tag < 6) {
      if (pCVar2->tag != 5) {
        __assert_fail("rep->tag == EXTERNAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0xcf,
                      "void absl::cord_internal::(anonymous namespace)::DeleteSubstring(CordRepSubstring *)"
                     );
      }
      pCVar3 = CordRep::external(pCVar2);
      CordRepExternal::Delete(&pCVar3->super_CordRep);
    }
    else {
      pCVar2 = &CordRep::flat(pCVar2)->super_CordRep;
      CordRepFlat::Delete(pCVar2);
    }
  }
  operator_delete(pCVar4,0x20);
  return;
}

Assistant:

void DeleteLeafEdge(CordRep* rep) {
  assert(IsDataEdge(rep));
  if (rep->tag >= FLAT) {
    CordRepFlat::Delete(rep->flat());
  } else if (rep->tag == EXTERNAL) {
    CordRepExternal::Delete(rep->external());
  } else {
    DeleteSubstring(rep->substring());
  }
}